

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O1

void cuddShrinkDeathRow(DdManager *table)

{
  uint uVar1;
  DdNode *n;
  ulong uVar2;
  int iVar3;
  DdNode **ppDVar4;
  int iVar5;
  ulong uVar6;
  
  uVar1 = table->deathRowDepth;
  if (3 < (int)uVar1) {
    iVar3 = table->deathRowDepth;
    if ((int)(uVar1 >> 2) < iVar3) {
      n = table->deathRow[uVar1 >> 2];
      uVar2 = (ulong)(uVar1 >> 2);
      while (n != (DdNode *)0x0) {
        uVar6 = uVar2 + 1;
        Cudd_IterDerefBdd(table,n);
        table->deathRow[uVar2] = (DdNode *)0x0;
        iVar3 = table->deathRowDepth;
        if ((long)iVar3 <= (long)uVar6) break;
        uVar2 = uVar6;
        n = table->deathRow[uVar6];
      }
    }
    iVar5 = iVar3 + 3;
    if (-1 < iVar3) {
      iVar5 = iVar3;
    }
    iVar5 = iVar5 >> 2;
    table->deathRowDepth = iVar5;
    table->deadMask = iVar5 - 1U;
    if (iVar5 - 1U < (uint)table->nextDead) {
      table->nextDead = 0;
    }
    if (table->deathRow == (DdNode **)0x0) {
      ppDVar4 = (DdNode **)malloc((long)iVar5 << 3);
    }
    else {
      ppDVar4 = (DdNode **)realloc(table->deathRow,(long)iVar5 << 3);
    }
    table->deathRow = ppDVar4;
  }
  return;
}

Assistant:

void
cuddShrinkDeathRow(
  DdManager *table)
{
#ifndef DD_NO_DEATH_ROW
    int i;

    if (table->deathRowDepth > 3) {
        for (i = table->deathRowDepth/4; i < table->deathRowDepth; i++) {
            if (table->deathRow[i] == NULL) break;
            Cudd_IterDerefBdd(table,table->deathRow[i]);
            table->deathRow[i] = NULL;
        }
        table->deathRowDepth /= 4;
        table->deadMask = table->deathRowDepth - 1;
        if ((unsigned) table->nextDead > table->deadMask) {
            table->nextDead = 0;
        }
        table->deathRow = ABC_REALLOC(DdNodePtr, table->deathRow,
                                   table->deathRowDepth);
    }
#endif

}